

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_open(lua_State *L)

{
  char *__filename;
  char *__modes;
  LStream *pLVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  FILE *pFVar5;
  int local_44;
  char *local_30;
  char *md;
  LStream *p;
  char *mode;
  char *filename;
  lua_State *L_local;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  pLVar1 = newfile(L);
  if (*__modes != '\0') {
    local_30 = __modes + 1;
    pcVar2 = strchr("rwa",(int)*__modes);
    if (pcVar2 != (char *)0x0) {
      if (*local_30 == '+') {
        local_30 = __modes + 2;
      }
      sVar3 = strspn(local_30,"b");
      sVar4 = strlen(local_30);
      if (sVar3 == sVar4) goto LAB_0012b230;
    }
  }
  luaL_argerror(L,2,"invalid mode");
LAB_0012b230:
  pFVar5 = fopen64(__filename,__modes);
  pLVar1->f = (FILE *)pFVar5;
  if (pLVar1->f == (FILE *)0x0) {
    local_44 = luaL_fileresult(L,0,__filename);
  }
  else {
    local_44 = 1;
  }
  return local_44;
}

Assistant:

static int io_open (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newfile(L);
  const char *md = mode;  /* to traverse/check mode */
  luaL_argcheck(L, l_checkmode(md), 2, "invalid mode");
  p->f = fopen(filename, mode);
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}